

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadstorage.cpp
# Opt level: O1

void ** __thiscall QThreadStorageData::get(QThreadStorageData *this)

{
  int iVar1;
  QThreadData *pQVar2;
  pointer ppvVar3;
  
  pQVar2 = QThreadData::currentThreadData();
  if (pQVar2 == (QThreadData *)0x0) {
    pQVar2 = QThreadData::createCurrentThreadData();
  }
  if (pQVar2 == (QThreadData *)0x0) {
    get();
    ppvVar3 = (void **)0x0;
  }
  else {
    if ((pQVar2->tls).d.size <= (long)this->id) {
      QList<void_*>::resize(&pQVar2->tls,(long)this->id + 1);
    }
    iVar1 = this->id;
    ppvVar3 = QList<void_*>::data(&pQVar2->tls);
    ppvVar3 = ppvVar3 + iVar1;
    if (*ppvVar3 == (void *)0x0) {
      ppvVar3 = (void **)0x0;
    }
  }
  return ppvVar3;
}

Assistant:

void **QThreadStorageData::get() const
{
    QThreadData *data = QThreadData::current();
    if (!data) {
        qWarning("QThreadStorage::get: QThreadStorage can only be used with threads started with QThread");
        return nullptr;
    }
    QList<void *> &tls = data->tls;
    if (tls.size() <= id)
        tls.resize(id + 1);
    void **v = &tls[id];

    DEBUG_MSG("QThreadStorageData: Returning storage %d, data %p, for thread %p",
          id,
          *v,
          data->thread.loadRelaxed());

    return *v ? v : nullptr;
}